

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSampler_Test::TestBody
          (Sampler_testProbabilisticSampler_Test *this)

{
  pointer *ppTVar1;
  char cVar2;
  Tag *__x;
  pointer pcVar3;
  ulong uVar4;
  long lVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ProbabilisticSampler sampler;
  long *local_1d0;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_1c8;
  pointer *local_1a8;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_1a0;
  AssertHelper local_188 [8];
  undefined1 local_180 [16];
  pointer pTStack_170;
  Tag local_168;
  undefined8 local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  byte local_f8;
  long *local_f0;
  undefined1 local_e8 [32];
  undefined4 local_c8;
  data_type *local_c0;
  undefined8 local_b8;
  data_type local_b0;
  undefined8 local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  byte local_68;
  undefined1 local_60 [16];
  pointer pTStack_50;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_48;
  
  ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)local_60,0.5);
  local_180._0_8_ = &pTStack_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"op","");
  local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,(Tag *)0x8000000000000009 < pTStack_50);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_1a0,&local_48)
  ;
  if ((pointer *)local_180._0_8_ != &pTStack_170) {
    operator_delete((void *)local_180._0_8_);
  }
  local_f0 = (long *)(CONCAT71(local_f0._1_7_,local_1a8._0_1_) ^ 1);
  local_e8._0_8_ = (Tag *)0x0;
  if (local_1a8._0_1_ == (string)0x0) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_f0 = (long *)0x2;
    local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(((long)local_1a0.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1a0.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_180,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
               "(result.tags()).size()",(unsigned_long *)&local_f0,(unsigned_long *)&local_1c8);
    if (local_180[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_f0);
      if ((Tag *)local_180._8_8_ == (Tag *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (((string *)local_180._8_8_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
      if (local_f0 != (long *)0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && (local_f0 != (long *)0x0)) {
          (**(code **)(*local_f0 + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_180 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_180 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          local_180._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
          local_180._8_8_ = &local_168;
          pTStack_170 = (Tag *)0x0;
          local_168._key._M_dataplus._M_p = local_168._key._M_dataplus._M_p & 0xffffffffffffff00;
          local_168._key.field_2._M_allocated_capacity._0_4_ = 0;
          local_168._key.field_2._8_8_ = &local_168._value.super_variant_type.data;
          local_168._value.super_variant_type.type_index = 0;
          local_168._value.super_variant_type.data.__data[0] = '\0';
          local_168._value.super_variant_type.data._16_8_ = 0;
          local_168._value.super_variant_type.data.__data[0x18] = '\0';
          local_120 = 0;
          local_118 = local_108;
          local_110 = 0;
          local_108[0] = 0;
          local_f8 = local_f8 & 0xe0;
          local_f0 = (long *)&sampling_manager::thrift::OperationSamplingStrategy::vtable;
          local_e8._0_8_ = local_e8 + 0x10;
          local_e8._8_8_ = (Tag *)0x0;
          local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
          local_c8 = 0;
          local_c0 = &local_b0;
          local_b8 = 0;
          local_b0.__data[0] = '\0';
          local_b0._16_8_ = 0;
          local_b0.__data[0x18] = '\0';
          local_90 = 0;
          local_88 = local_78;
          local_80 = 0;
          local_78[0] = 0;
          local_68 = local_68 & 0xe0;
          jaegertracing::Tag::thrift
                    ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags + lVar5));
          jaegertracing::Tag::thrift
                    ((Tag *)((long)&((local_1a0.
                                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus.
                                    _M_p + lVar5));
          testing::internal::CmpHelperEQ<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                    ((internal *)&local_1c8,"thriftTagArr","thriftTagVec",(Tag *)local_180,
                     (Tag *)&local_f0);
          if (local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start._0_1_ == (Message)0x0) {
            testing::Message::Message((Message *)&local_1d0);
            if (local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_finish == (Tag *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_1c8.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x77,pcVar3);
            testing::internal::AssertHelper::operator=(local_188,(Message *)&local_1d0);
            testing::internal::AssertHelper::~AssertHelper(local_188);
            if (local_1d0 != (long *)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') && (local_1d0 != (long *)0x0)) {
                (**(code **)(*local_1d0 + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1c8.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001bbb20;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1c8.
                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          jaegertracing::thrift::Tag::~Tag((Tag *)&local_f0);
          jaegertracing::thrift::Tag::~Tag((Tag *)local_180);
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x48;
        } while (uVar4 < (ulong)(((long)local_1a0.
                                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1a0.
                                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x71c71c71c71c71c7));
      }
      local_f0 = (long *)(local_e8 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"op","");
      local_180[0] = (string)((Tag *)0x7fffffffffffffeb < pTStack_50);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_180 + 8),
                 &local_48);
      local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,local_180[0]);
      local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_168._key._M_dataplus._M_p;
      local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_180._8_8_;
      local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_finish = pTStack_170;
      local_180._8_8_ = (Tag *)0x0;
      pTStack_170 = (Tag *)0x0;
      local_168._key._M_dataplus._M_p = (pointer)0x0;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1c8);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_180 + 8))
      ;
      if (local_f0 != (long *)(local_e8 + 8)) {
        operator_delete(local_f0);
      }
      local_f0 = (long *)CONCAT71(local_f0._1_7_,local_1a8._0_1_);
      local_e8._0_8_ = (Tag *)0x0;
      if (local_1a8._0_1_ == (string)0x0) {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_180,(char *)&local_f0,"result.isSampled()","false");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x7b,(char *)local_180._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
        if ((pointer *)local_180._0_8_ != &pTStack_170) {
          operator_delete((void *)local_180._0_8_);
        }
        if (local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start != (Tag *)0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') &&
             (local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start != (Tag *)0x0)) {
            (**(code **)(((local_1c8.
                           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))
                      ();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
        local_f0 = (long *)0x2;
        local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(((long)local_1a0.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1a0.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)
        ;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_180,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
                   "(result.tags()).size()",(unsigned_long *)&local_f0,(unsigned_long *)&local_1c8);
        if (local_180[0] != (string)0x0) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_180 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar5 = 0;
            uVar4 = 0;
LAB_001bb545:
            local_180._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
            local_180._8_8_ = &local_168;
            pTStack_170 = (Tag *)0x0;
            local_168._key._M_dataplus._M_p = local_168._key._M_dataplus._M_p & 0xffffffffffffff00;
            local_168._key.field_2._M_allocated_capacity._0_4_ = 0;
            local_168._key.field_2._8_8_ = &local_168._value.super_variant_type.data;
            local_168._value.super_variant_type.type_index = 0;
            local_168._value.super_variant_type.data.__data[0] = '\0';
            local_168._value.super_variant_type.data._16_8_ = 0;
            local_168._value.super_variant_type.data.__data[0x18] = '\0';
            local_120 = 0;
            local_118 = local_108;
            local_110 = 0;
            local_108[0] = 0;
            local_f8 = local_f8 & 0xe0;
            local_f0 = (long *)&sampling_manager::thrift::OperationSamplingStrategy::vtable;
            local_e8._0_8_ = local_e8 + 0x10;
            local_e8._8_8_ = (Tag *)0x0;
            local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
            local_c8 = 0;
            local_c0 = &local_b0;
            local_b8 = 0;
            local_b0.__data[0] = '\0';
            local_b0._16_8_ = 0;
            local_b0.__data[0x18] = '\0';
            local_90 = 0;
            local_88 = local_78;
            local_80 = 0;
            local_78[0] = 0;
            local_68 = local_68 & 0xe0;
            jaegertracing::Tag::thrift
                      ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags + lVar5));
            jaegertracing::Tag::thrift
                      ((Tag *)((long)&((local_1a0.
                                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_key).
                                      _M_dataplus._M_p + lVar5));
            testing::internal::CmpHelperEQ<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                      ((internal *)&local_1c8,"thriftTagArr","thriftTagVec",(Tag *)local_180,
                       (Tag *)&local_f0);
            if (local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_ != (Message)0x0) goto LAB_001bb6a2;
            testing::Message::Message((Message *)&local_1d0);
            if (local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_finish == (Tag *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_1c8.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x7c,pcVar3);
            testing::internal::AssertHelper::operator=(local_188,(Message *)&local_1d0);
            testing::internal::AssertHelper::~AssertHelper(local_188);
            if (local_1d0 != (long *)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') && (local_1d0 != (long *)0x0)) {
                (**(code **)(*local_1d0 + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1c8.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001bbb20:
            jaegertracing::thrift::Tag::~Tag((Tag *)&local_f0);
            jaegertracing::thrift::Tag::~Tag((Tag *)local_180);
            goto LAB_001bbbaf;
          }
LAB_001bb6ea:
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1a0);
          local_60._0_8_ = &PTR__ProbabilisticSampler_0020dcc8;
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_48);
          ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)local_180,1.0);
          local_60._0_8_ = &pTStack_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"op","");
          __x = &local_168;
          local_f0 = (long *)CONCAT71(local_f0._1_7_,(byte)((ulong)pTStack_170 >> 0x3f));
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
                    ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_e8,
                     (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)__x);
          if ((pointer *)local_60._0_8_ != &pTStack_50) {
            operator_delete((void *)local_60._0_8_);
          }
          local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,local_f0._0_1_);
          local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start = (Tag *)0x0;
          if (local_f0._0_1_ == (Tag)0x0) {
            testing::Message::Message((Message *)&local_1c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)local_60,(char *)&local_1a8,"result.isSampled()","false");
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x82,(char *)local_60._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1d0,(Message *)&local_1c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
            if ((pointer *)local_60._0_8_ != &pTStack_50) {
              operator_delete((void *)local_60._0_8_);
            }
            if (local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_start != (Tag *)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') &&
                 (local_1c8.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_start != (Tag *)0x0)) {
                (**(code **)(((local_1c8.
                               super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p +
                            8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            ppTVar1 = &local_1a0.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            local_1a8 = ppTVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"op","");
            local_60[0] = (string)((Tag *)0x7fffffffffffffeb < pTStack_170);
            std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
                      ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                       (local_60 + 8),
                       (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)__x);
            local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._16_8_;
            local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
            local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
            local_f0 = (long *)CONCAT71(local_f0._1_7_,local_60[0]);
            local_e8._16_8_ =
                 local_48.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_start;
            local_e8._0_8_ = local_60._8_8_;
            local_e8._8_8_ = pTStack_50;
            local_60._8_8_ = (Tag *)0x0;
            pTStack_50 = (Tag *)0x0;
            local_48.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                      (&local_1c8);
            std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                      ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                       (local_60 + 8));
            if (local_1a8 != ppTVar1) {
              operator_delete(local_1a8);
            }
            local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,local_f0._0_1_);
            local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start = (Tag *)0x0;
            if (local_f0._0_1_ == (Tag)0x0) {
              testing::Message::Message((Message *)&local_1c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_60,(char *)&local_1a8,"result.isSampled()","false"
                        );
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_1d0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                         ,0x86,(char *)local_60._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_1d0,(Message *)&local_1c8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
              if ((pointer *)local_60._0_8_ != &pTStack_50) {
                operator_delete((void *)local_60._0_8_);
              }
              if (local_1c8.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_start != (Tag *)0x0) {
                cVar2 = testing::internal::IsTrue(true);
                if ((cVar2 != '\0') &&
                   (local_1c8.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_start != (Tag *)0x0)) {
                  (**(code **)(((local_1c8.
                                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p
                              + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                    ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_e8);
          local_180._0_8_ = &PTR__ProbabilisticSampler_0020dcc8;
          goto LAB_001bbbd0;
        }
        testing::Message::Message((Message *)&local_f0);
        if ((Tag *)local_180._8_8_ == (Tag *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (((string *)local_180._8_8_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x7c,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
        if (local_f0 != (long *)0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') && (local_f0 != (long *)0x0)) {
            (**(code **)(*local_f0 + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_180 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_180,(char *)&local_f0,"result.isSampled()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0x76,(char *)local_180._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((pointer *)local_180._0_8_ != &pTStack_170) {
      operator_delete((void *)local_180._0_8_);
    }
    if (local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (Tag *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (Tag *)0x0)) {
        (**(code **)(((local_1c8.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
LAB_001bbbaf:
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1a0);
  local_60._0_8_ = &PTR__ProbabilisticSampler_0020dcc8;
  __x = (Tag *)&local_48;
LAB_001bbbd0:
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)__x);
  return;
LAB_001bb6a2:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  jaegertracing::thrift::Tag::~Tag((Tag *)&local_f0);
  jaegertracing::thrift::Tag::~Tag((Tag *)local_180);
  uVar4 = uVar4 + 1;
  lVar5 = lVar5 + 0x48;
  if ((ulong)(((long)local_1a0.
                     super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a0.
                     super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) <= uVar4)
  goto LAB_001bb6ea;
  goto LAB_001bb545;
}

Assistant:

TEST(Sampler, testProbabilisticSampler)
{
    {
        ProbabilisticSampler sampler(0.5);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
        ASSERT_FALSE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());
    }
    {
        ProbabilisticSampler sampler(1.0);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID), kTestOperationName);
        ASSERT_TRUE(result.isSampled());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
    }
}